

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::ResolveContinues
          (SQCompiler *this,SQFuncState *funcstate,SQInteger ntoresolve,SQInteger targetpos)

{
  long pos_00;
  longlong *plVar1;
  SQInteger pos;
  SQInteger targetpos_local;
  SQInteger ntoresolve_local;
  SQFuncState *funcstate_local;
  SQCompiler *this_local;
  
  for (targetpos_local = ntoresolve; 0 < targetpos_local; targetpos_local = targetpos_local + -1) {
    plVar1 = sqvector<long_long>::back(&funcstate->_unresolvedcontinues);
    pos_00 = *plVar1;
    sqvector<long_long>::pop_back(&funcstate->_unresolvedcontinues);
    SQFuncState::SetIntructionParams(funcstate,pos_00,0,targetpos - pos_00,0,0);
  }
  return;
}

Assistant:

void ResolveContinues(SQFuncState *funcstate, SQInteger ntoresolve, SQInteger targetpos)
    {
        while(ntoresolve > 0) {
            SQInteger pos = funcstate->_unresolvedcontinues.back();
            funcstate->_unresolvedcontinues.pop_back();
            //set the jmp instruction
            funcstate->SetIntructionParams(pos, 0, targetpos - pos, 0);
            ntoresolve--;
        }
    }